

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void ** mspace_independent_calloc(mspace msp,size_t n_elements,size_t elem_size,void **chunks)

{
  void **ppvVar1;
  mstate ms;
  size_t sz;
  void **chunks_local;
  size_t elem_size_local;
  size_t n_elements_local;
  mspace msp_local;
  
  ms = (mstate)elem_size;
  sz = (size_t)chunks;
  chunks_local = (void **)elem_size;
  elem_size_local = n_elements;
  n_elements_local = (size_t)msp;
  ppvVar1 = ialloc((mstate)msp,n_elements,(size_t *)&ms,3,chunks);
  return ppvVar1;
}

Assistant:

void** mspace_independent_calloc(mspace msp, size_t n_elements,
                                 size_t elem_size, void* chunks[]) {
  size_t sz = elem_size; /* serves as 1-element array */
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  return ialloc(ms, n_elements, &sz, 3, chunks);
}